

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void aom_comp_mask_pred_ssse3
               (uint8_t *comp_pred,uint8_t *pred,int width,int height,uint8_t *ref,int ref_stride,
               uint8_t *mask,int mask_stride,int invert_mask)

{
  uint8_t *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [16];
  int iVar23;
  uint8_t *src1;
  int iVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  int x;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  
  auVar22 = _DAT_00474870;
  iVar26 = ref_stride;
  src1 = ref;
  iVar23 = width;
  if (invert_mask == 0) {
    iVar26 = width;
    src1 = pred;
    iVar23 = ref_stride;
    pred = ref;
  }
  lVar25 = (long)iVar23;
  lVar27 = (long)mask_stride;
  if (width == 8) {
    lVar28 = 0;
    do {
      uVar2 = *(ulong *)pred;
      uVar3 = *(undefined8 *)src1;
      auVar53._8_6_ = 0;
      auVar53._0_8_ = uVar2;
      auVar53[0xe] = (char)(uVar2 >> 0x38);
      auVar53[0xf] = (char)((ulong)uVar3 >> 0x38);
      auVar34._14_2_ = auVar53._14_2_;
      auVar34._8_5_ = 0;
      auVar34._0_8_ = uVar2;
      auVar34[0xd] = (char)((ulong)uVar3 >> 0x30);
      auVar35._13_3_ = auVar34._13_3_;
      auVar35._8_4_ = 0;
      auVar35._0_8_ = uVar2;
      auVar35[0xc] = (char)(uVar2 >> 0x30);
      auVar33._12_4_ = auVar35._12_4_;
      auVar33._8_3_ = 0;
      auVar33._0_8_ = uVar2;
      auVar33[0xb] = (char)((ulong)uVar3 >> 0x28);
      auVar32._11_5_ = auVar33._11_5_;
      auVar32._8_2_ = 0;
      auVar32._0_8_ = uVar2;
      auVar32[10] = (char)(uVar2 >> 0x28);
      auVar31._10_6_ = auVar32._10_6_;
      auVar31[8] = 0;
      auVar31._0_8_ = uVar2;
      auVar31[9] = (char)((ulong)uVar3 >> 0x20);
      auVar30._9_7_ = auVar31._9_7_;
      auVar30[8] = (char)(uVar2 >> 0x20);
      auVar30._0_8_ = uVar2;
      auVar29._8_8_ = auVar30._8_8_;
      auVar29[7] = (char)((ulong)uVar3 >> 0x18);
      auVar29[6] = (char)(uVar2 >> 0x18);
      auVar29[5] = (char)((ulong)uVar3 >> 0x10);
      auVar29[4] = (char)(uVar2 >> 0x10);
      auVar29[3] = (char)((ulong)uVar3 >> 8);
      auVar29[2] = (char)(uVar2 >> 8);
      auVar29[0] = (undefined1)uVar2;
      auVar29[1] = (char)uVar3;
      uVar2 = *(ulong *)mask;
      uVar4 = *(ulong *)((long)pred + lVar25);
      uVar3 = *(undefined8 *)(src1 + iVar26);
      cVar54 = (char)(uVar2 >> 8);
      cVar55 = (char)(uVar2 >> 0x10);
      cVar56 = (char)(uVar2 >> 0x18);
      cVar57 = (char)(uVar2 >> 0x20);
      cVar58 = (char)(uVar2 >> 0x28);
      cVar59 = (char)(uVar2 >> 0x30);
      cVar60 = (char)(uVar2 >> 0x38);
      uVar5 = *(undefined8 *)((long)mask + lVar27);
      cVar61 = (char)((ulong)uVar5 >> 8);
      cVar62 = (char)((ulong)uVar5 >> 0x10);
      cVar63 = (char)((ulong)uVar5 >> 0x18);
      cVar64 = (char)((ulong)uVar5 >> 0x20);
      cVar65 = (char)((ulong)uVar5 >> 0x28);
      cVar66 = (char)((ulong)uVar5 >> 0x30);
      cVar67 = (char)((ulong)uVar5 >> 0x38);
      auVar52._8_6_ = 0;
      auVar52._0_8_ = uVar4;
      auVar52[0xe] = (char)(uVar4 >> 0x38);
      auVar52[0xf] = (char)((ulong)uVar3 >> 0x38);
      auVar51._14_2_ = auVar52._14_2_;
      auVar51._8_5_ = 0;
      auVar51._0_8_ = uVar4;
      auVar51[0xd] = (char)((ulong)uVar3 >> 0x30);
      auVar50._13_3_ = auVar51._13_3_;
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar4;
      auVar50[0xc] = (char)(uVar4 >> 0x30);
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._8_3_ = 0;
      auVar49._0_8_ = uVar4;
      auVar49[0xb] = (char)((ulong)uVar3 >> 0x28);
      auVar48._11_5_ = auVar49._11_5_;
      auVar48._8_2_ = 0;
      auVar48._0_8_ = uVar4;
      auVar48[10] = (char)(uVar4 >> 0x28);
      auVar47._10_6_ = auVar48._10_6_;
      auVar47[8] = 0;
      auVar47._0_8_ = uVar4;
      auVar47[9] = (char)((ulong)uVar3 >> 0x20);
      auVar46._9_7_ = auVar47._9_7_;
      auVar46[8] = (char)(uVar4 >> 0x20);
      auVar46._0_8_ = uVar4;
      auVar45._8_8_ = auVar46._8_8_;
      auVar45[7] = (char)((ulong)uVar3 >> 0x18);
      auVar45[6] = (char)(uVar4 >> 0x18);
      auVar45[5] = (char)((ulong)uVar3 >> 0x10);
      auVar45[4] = (char)(uVar4 >> 0x10);
      auVar45[3] = (char)((ulong)uVar3 >> 8);
      auVar45[2] = (char)(uVar4 >> 8);
      auVar45[0] = (undefined1)uVar4;
      auVar45[1] = (char)uVar3;
      auVar44._8_6_ = 0;
      auVar44._0_8_ = uVar2;
      auVar44[0xe] = cVar60;
      auVar44[0xf] = '@' - cVar60;
      auVar43._14_2_ = auVar44._14_2_;
      auVar43._8_5_ = 0;
      auVar43._0_8_ = uVar2;
      auVar43[0xd] = '@' - cVar59;
      auVar42._13_3_ = auVar43._13_3_;
      auVar42._8_4_ = 0;
      auVar42._0_8_ = uVar2;
      auVar42[0xc] = cVar59;
      auVar41._12_4_ = auVar42._12_4_;
      auVar41._8_3_ = 0;
      auVar41._0_8_ = uVar2;
      auVar41[0xb] = '@' - cVar58;
      auVar40._11_5_ = auVar41._11_5_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = uVar2;
      auVar40[10] = cVar58;
      auVar39._10_6_ = auVar40._10_6_;
      auVar39[8] = 0;
      auVar39._0_8_ = uVar2;
      auVar39[9] = '@' - cVar57;
      auVar38._9_7_ = auVar39._9_7_;
      auVar38[8] = cVar57;
      auVar38._0_8_ = uVar2;
      auVar37._8_8_ = auVar38._8_8_;
      auVar37[7] = '@' - cVar56;
      auVar37[6] = cVar56;
      auVar37[5] = '@' - cVar55;
      auVar37[4] = cVar55;
      auVar37[3] = '@' - cVar54;
      auVar37[2] = cVar54;
      auVar37[1] = '@' - (char)uVar2;
      auVar37[0] = (char)uVar2;
      auVar35 = pmaddubsw(auVar29,auVar37);
      auVar36[1] = '@' - (char)uVar5;
      auVar36[0] = (char)uVar5;
      auVar36[2] = cVar61;
      auVar36[3] = '@' - cVar61;
      auVar36[4] = cVar62;
      auVar36[5] = '@' - cVar62;
      auVar36[6] = cVar63;
      auVar36[7] = '@' - cVar63;
      auVar36[8] = cVar64;
      auVar36[9] = '@' - cVar64;
      auVar36[10] = cVar65;
      auVar36[0xb] = '@' - cVar65;
      auVar36[0xc] = cVar66;
      auVar36[0xd] = '@' - cVar66;
      auVar36[0xe] = cVar67;
      auVar36[0xf] = '@' - cVar67;
      auVar53 = pmaddubsw(auVar45,auVar36);
      auVar36 = pmulhrsw(auVar35,auVar22);
      auVar35 = pmulhrsw(auVar53,auVar22);
      sVar6 = auVar36._0_2_;
      sVar7 = auVar36._2_2_;
      sVar8 = auVar36._4_2_;
      sVar9 = auVar36._6_2_;
      sVar10 = auVar36._8_2_;
      sVar11 = auVar36._10_2_;
      sVar12 = auVar36._12_2_;
      sVar13 = auVar36._14_2_;
      sVar14 = auVar35._0_2_;
      sVar15 = auVar35._2_2_;
      sVar16 = auVar35._4_2_;
      sVar17 = auVar35._6_2_;
      sVar18 = auVar35._8_2_;
      sVar19 = auVar35._10_2_;
      sVar20 = auVar35._12_2_;
      sVar21 = auVar35._14_2_;
      puVar1 = comp_pred + lVar28 * 8;
      *puVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar36[0] - (0xff < sVar6);
      puVar1[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar36[2] - (0xff < sVar7);
      puVar1[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar36[4] - (0xff < sVar8);
      puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar36[6] - (0xff < sVar9);
      puVar1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar36[8] - (0xff < sVar10);
      puVar1[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar36[10] - (0xff < sVar11);
      puVar1[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar36[0xc] - (0xff < sVar12);
      puVar1[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar36[0xe] - (0xff < sVar13);
      puVar1[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar35[0] - (0xff < sVar14);
      puVar1[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar35[2] - (0xff < sVar15);
      puVar1[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar35[4] - (0xff < sVar16);
      puVar1[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar35[6] - (0xff < sVar17);
      puVar1[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar35[8] - (0xff < sVar18);
      puVar1[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar35[10] - (0xff < sVar19);
      puVar1[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar35[0xc] - (0xff < sVar20);
      puVar1[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar35[0xe] - (0xff < sVar21);
      pred = (uint8_t *)((long)pred + (long)(iVar23 * 2));
      src1 = src1 + iVar26 * 2;
      mask = (uint8_t *)((long)mask + (long)(mask_stride * 2));
      lVar28 = lVar28 + 2;
    } while ((int)lVar28 < height);
  }
  else if (width == 0x10) {
    iVar24 = 0;
    do {
      comp_mask_pred_16_ssse3(pred,src1,mask,comp_pred);
      comp_mask_pred_16_ssse3
                ((uint8_t *)((long)pred + lVar25),src1 + iVar26,mask + lVar27,comp_pred + 0x10);
      pred = (uint8_t *)((long)pred + (long)(iVar23 * 2));
      src1 = src1 + iVar26 * 2;
      mask = mask + mask_stride * 2;
      iVar24 = iVar24 + 2;
      comp_pred = comp_pred + 0x20;
    } while (iVar24 < height);
  }
  else {
    iVar23 = 0;
    do {
      for (lVar28 = 0; lVar28 < width; lVar28 = lVar28 + 0x20) {
        comp_mask_pred_16_ssse3
                  ((uint8_t *)((long)pred + lVar28),src1 + lVar28,mask + lVar28,comp_pred + lVar28);
        comp_mask_pred_16_ssse3
                  ((uint8_t *)((long)pred + lVar28 + 0x10),src1 + lVar28 + 0x10,mask + lVar28 + 0x10
                   ,comp_pred + lVar28 + 0x10);
      }
      pred = (uint8_t *)((long)pred + lVar25);
      src1 = src1 + iVar26;
      mask = mask + lVar27;
      iVar23 = iVar23 + 1;
      comp_pred = comp_pred + lVar28;
    } while (iVar23 < height);
  }
  return;
}

Assistant:

void aom_comp_mask_pred_ssse3(uint8_t *comp_pred, const uint8_t *pred,
                              int width, int height, const uint8_t *ref,
                              int ref_stride, const uint8_t *mask,
                              int mask_stride, int invert_mask) {
  const uint8_t *src0 = invert_mask ? pred : ref;
  const uint8_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  assert(height % 2 == 0);
  int i = 0;
  if (width == 8) {
    comp_mask_pred_8_ssse3(comp_pred, height, src0, stride0, src1, stride1,
                           mask, mask_stride);
  } else if (width == 16) {
    do {
      comp_mask_pred_16_ssse3(src0, src1, mask, comp_pred);
      comp_mask_pred_16_ssse3(src0 + stride0, src1 + stride1,
                              mask + mask_stride, comp_pred + width);
      comp_pred += (width << 1);
      src0 += (stride0 << 1);
      src1 += (stride1 << 1);
      mask += (mask_stride << 1);
      i += 2;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        comp_mask_pred_16_ssse3(src0 + x, src1 + x, mask + x, comp_pred);
        comp_mask_pred_16_ssse3(src0 + x + 16, src1 + x + 16, mask + x + 16,
                                comp_pred + 16);
        comp_pred += 32;
      }
      src0 += (stride0);
      src1 += (stride1);
      mask += (mask_stride);
      i += 1;
    } while (i < height);
  }
}